

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

uint8_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
tagsOffset(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint8_t *start)

{
  byte bVar1;
  byte *in_RSI;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_RDI;
  uint8_t offset;
  uint8_t ret;
  uint8_t local_11;
  byte *local_10;
  
  local_11 = '\0';
  local_10 = in_RSI;
  while ((SliceStaticData::TypeMap[*local_10] == Tagged &&
         (bVar1 = tagOffset(in_RDI,local_10), bVar1 != 0))) {
    local_11 = local_11 + bVar1;
    local_10 = local_10 + (int)(uint)bVar1;
  }
  return local_11;
}

Assistant:

uint8_t tagsOffset(uint8_t const* start) const noexcept {
    uint8_t ret = 0;

    while (SliceStaticData::TypeMap[*start] == ValueType::Tagged) {
      uint8_t offset = tagOffset(start);
      VELOCYPACK_ASSERT(offset != 0);
      if (VELOCYPACK_UNLIKELY(offset == 0)) {
        // prevent endless loop
        break;
      }
      ret += offset;
      start += offset;
    }

    return ret;
  }